

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

bool __thiscall
QTableModel::setItemData(QTableModel *this,QModelIndex *index,QMap<int,_QVariant> *roles)

{
  bool bVar1;
  int iVar2;
  QTableWidgetItem *item;
  QTableWidgetItem *pQVar3;
  int *piVar4;
  uint *puVar5;
  QVariant *pQVar6;
  QTableModel *pQVar7;
  QModelIndex *in_RSI;
  long in_FS_OFFSET;
  int role;
  QTableWidgetItem *itm;
  QTableWidget *view;
  ConstIterator it_1;
  ConstIterator it;
  QList<int> rolesVec;
  undefined4 in_stack_ffffffffffffff18;
  parameter_type in_stack_ffffffffffffff1c;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  QTableModel *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  QTableModel *in_stack_ffffffffffffff38;
  QTableWidgetItem *in_stack_ffffffffffffff48;
  uint local_a4;
  bool local_61;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QModelIndex::isValid
                    ((QModelIndex *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  if (bVar1) {
    item = (QTableWidgetItem *)QTableModel::view((QTableModel *)0x8d61ba);
    pQVar3 = QTableModel::item(in_stack_ffffffffffffff38,
                               (QModelIndex *)
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    if (pQVar3 == (QTableWidgetItem *)0x0) {
      if (item == (QTableWidgetItem *)0x0) {
        local_61 = false;
      }
      else {
        pQVar7 = (QTableModel *)
                 createItem((QTableModel *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        QMap<int,_QVariant>::constBegin
                  ((QMap<int,_QVariant> *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        while( true ) {
          QMap<int,_QVariant>::constEnd
                    ((QMap<int,_QVariant> *)
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          bVar1 = ::operator!=((const_iterator *)
                               CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                               (const_iterator *)
                               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          if (!bVar1) break;
          in_stack_ffffffffffffff38 = pQVar7;
          piVar4 = QMap<int,_QVariant>::const_iterator::key((const_iterator *)0x8d6445);
          iVar2 = *piVar4;
          pQVar6 = QMap<int,_QVariant>::const_iterator::value((const_iterator *)0x8d6458);
          (**(code **)(*(long *)in_stack_ffffffffffffff38 + 0x20))
                    (in_stack_ffffffffffffff38,iVar2,pQVar6);
          QMap<int,_QVariant>::const_iterator::operator++
                    ((const_iterator *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20)
                    );
        }
        iVar2 = QModelIndex::row(in_RSI);
        QModelIndex::column(in_RSI);
        QTableWidget::setItem
                  ((QTableWidget *)in_stack_ffffffffffffff38,iVar2,in_stack_ffffffffffffff30,item);
        local_61 = true;
      }
    }
    else {
      pQVar3->view = (QTableWidget *)0x0;
      QList<int>::QList((QList<int> *)0x8d6226);
      QMap<int,_QVariant>::constBegin
                ((QMap<int,_QVariant> *)
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      while( true ) {
        QMap<int,_QVariant>::constEnd
                  ((QMap<int,_QVariant> *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        bVar1 = ::operator!=((const_iterator *)
                             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                             (const_iterator *)
                             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        if (!bVar1) break;
        piVar4 = QMap<int,_QVariant>::const_iterator::key((const_iterator *)0x8d6284);
        if (*piVar4 == 2) {
          local_a4 = 0;
        }
        else {
          puVar5 = (uint *)QMap<int,_QVariant>::const_iterator::key((const_iterator *)0x8d629e);
          local_a4 = *puVar5;
        }
        (*pQVar3->_vptr_QTableWidgetItem[3])(&local_28,pQVar3,(ulong)local_a4);
        QMap<int,_QVariant>::const_iterator::value((const_iterator *)0x8d62d0);
        bVar1 = ::operator!=((QVariant *)
                             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                             (QVariant *)
                             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        ::QVariant::~QVariant(&local_28);
        if (bVar1) {
          in_stack_ffffffffffffff48 = pQVar3;
          pQVar6 = QMap<int,_QVariant>::const_iterator::value((const_iterator *)0x8d631a);
          (*in_stack_ffffffffffffff48->_vptr_QTableWidgetItem[4])
                    (in_stack_ffffffffffffff48,(ulong)local_a4,pQVar6);
          QList<int>::operator+=
                    ((QList<int> *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff1c);
          if (local_a4 == 0) {
            QList<int>::operator+=
                      ((QList<int> *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff1c);
          }
        }
        QMap<int,_QVariant>::const_iterator::operator++
                  ((const_iterator *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      }
      pQVar3->view = (QTableWidget *)item;
      bVar1 = QList<int>::isEmpty((QList<int> *)0x8d6387);
      if (!bVar1) {
        itemChanged(in_stack_ffffffffffffff28,in_stack_ffffffffffffff48,
                    (QList<int> *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      }
      local_61 = true;
      QList<int>::~QList((QList<int> *)0x8d63b7);
    }
  }
  else {
    local_61 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_61;
}

Assistant:

bool QTableModel::setItemData(const QModelIndex &index, const QMap<int, QVariant> &roles)
{
    if (!index.isValid())
        return false;

    QTableWidget *view = this->view();
    QTableWidgetItem *itm = item(index);
    if (itm) {
        itm->view = nullptr; // prohibits item from calling itemChanged()
        QList<int> rolesVec;
        for (QMap<int, QVariant>::ConstIterator it = roles.constBegin(); it != roles.constEnd(); ++it) {
            const int role = (it.key() == Qt::EditRole ? Qt::DisplayRole : it.key());
            if (itm->data(role) != it.value()) {
                itm->setData(role, it.value());
                rolesVec += role;
                if (role == Qt::DisplayRole)
                    rolesVec += Qt::EditRole;
            }
        }
        itm->view = view;
        if (!rolesVec.isEmpty())
            itemChanged(itm, rolesVec);
        return true;
    }

    if (!view)
        return false;

    itm = createItem();
    for (QMap<int, QVariant>::ConstIterator it = roles.constBegin(); it != roles.constEnd(); ++it)
        itm->setData(it.key(), it.value());
    view->setItem(index.row(), index.column(), itm);
    return true;
}